

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

float calculateNoise(Mat *inputImg)

{
  float fVar1;
  int y;
  int iVar2;
  double dVar3;
  float fVar4;
  
  iVar2 = *(int *)(inputImg + 8);
  if (iVar2 < 1) {
    fVar4 = 0.0;
  }
  else {
    fVar4 = 0.0;
    y = 0;
    do {
      if (0 < *(int *)(inputImg + 0xc)) {
        iVar2 = 0;
        do {
          dVar3 = getVariance(inputImg,y,iVar2);
          fVar1 = fVar4 + 1.0;
          if (dVar3 <= 450.0) {
            fVar1 = fVar4;
          }
          fVar4 = fVar1;
          iVar2 = iVar2 + 1;
        } while (iVar2 < *(int *)(inputImg + 0xc));
      }
      y = y + 1;
      iVar2 = *(int *)(inputImg + 8);
    } while (y < iVar2);
  }
  return (fVar4 / (float)(iVar2 * *(int *)(inputImg + 0xc))) * 100.0;
}

Assistant:

float calculateNoise(Mat inputImg) {
    float numOfNoisy = 0.0;
    for (int i = 0; i < inputImg.rows; i ++) {
        for (int j = 0; j < inputImg.cols; j++) {
            if ( getVariance(inputImg, i, j)  > 450) {
                numOfNoisy++;
            }
        }
    }
    return  ( numOfNoisy / (inputImg.rows * inputImg.cols) ) * 100;
}